

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  uint uVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  long lVar9;
  Real a;
  int iVar10;
  long lVar11;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  cpp_dec_float<100U,_int,_void> *v;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Item *pIVar16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar10 = *(x->super_IdxSet).idx;
  pnVar7 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[iVar10].m_backend.data;
  local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[iVar10].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar7[iVar10].m_backend.data + 0x10);
  local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar7[iVar10].m_backend.data + 0x20);
  local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar7[iVar10].m_backend.data + 0x30);
  local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  iVar3 = pnVar7[iVar10].m_backend.exp;
  bVar2 = pnVar7[iVar10].m_backend.neg;
  fVar4 = pnVar7[iVar10].m_backend.fpclass;
  iVar5 = pnVar7[iVar10].m_backend.prec_elem;
  pIVar16 = (A->set).theitem + (A->set).thekey[iVar10].idx;
  local_d8.exp = iVar3;
  local_d8.neg = bVar2;
  local_d8.fpclass = fVar4;
  local_d8.prec_elem = iVar5;
  local_88.data._M_elems._0_8_ = local_d8.data._M_elems._0_8_;
  local_88.data._M_elems._8_8_ = local_d8.data._M_elems._8_8_;
  local_88.data._M_elems._16_8_ = local_d8.data._M_elems._16_8_;
  local_88.data._M_elems._24_8_ = local_d8.data._M_elems._24_8_;
  local_88.data._M_elems._32_8_ = local_d8.data._M_elems._32_8_;
  local_88.data._M_elems._40_8_ = local_d8.data._M_elems._40_8_;
  local_88.data._M_elems._48_8_ = local_d8.data._M_elems._48_8_;
  local_88.data._M_elems._56_8_ = local_d8.data._M_elems._56_8_;
  a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  local_88.neg = bVar2;
  if ((bVar2 == true) && (local_88.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_88.neg = false;
  }
  local_88.exp = iVar3;
  local_88.fpclass = fVar4;
  local_88.prec_elem = iVar5;
  if ((fVar4 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems._56_5_ = 0;
    local_128.data._M_elems[0xf]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_128,a);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_88,&local_128);
    if (iVar10 < 1) goto LAB_003d1048;
  }
  uVar6 = (pIVar16->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  uVar13 = (ulong)uVar6;
  if (uVar13 != 0) {
    *(uint *)(this + 8) = uVar6;
    if ((int)uVar6 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    uVar14 = uVar13 + 1;
    lVar15 = uVar13 * 0x54;
    do {
      pNVar8 = (pIVar16->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar12 = (cpp_dec_float<100U,_int,_void> *)((long)&pNVar8[-1].val.m_backend.data + lVar15);
      *(undefined4 *)(*(long *)(this + 0x10) + -8 + uVar14 * 4) =
           *(undefined4 *)((long)(&pNVar8[-1].val + 1) + lVar15);
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      v = &local_d8;
      if (pcVar12 != &local_128) {
        local_128.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
        local_128.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
        local_128.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
        local_128.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
        local_128.data._M_elems[8] = local_d8.data._M_elems[8];
        local_128.data._M_elems[9] = local_d8.data._M_elems[9];
        local_128.data._M_elems[10] = local_d8.data._M_elems[10];
        local_128.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
        local_128.data._M_elems[4] = local_d8.data._M_elems[4];
        local_128.data._M_elems[5] = local_d8.data._M_elems[5];
        local_128.data._M_elems[6] = local_d8.data._M_elems[6];
        local_128.data._M_elems[7] = local_d8.data._M_elems[7];
        local_128.data._M_elems[0] = local_d8.data._M_elems[0];
        local_128.data._M_elems[1] = local_d8.data._M_elems[1];
        local_128.data._M_elems[2] = local_d8.data._M_elems[2];
        local_128.data._M_elems[3] = local_d8.data._M_elems[3];
        local_128.exp = local_d8.exp;
        local_128.neg = local_d8.neg;
        local_128.prec_elem = local_d8.prec_elem;
        local_128.fpclass = local_d8.fpclass;
        v = pcVar12;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_128,v);
      lVar9 = *(long *)(this + 0x20);
      lVar11 = (long)(int)pcVar12[1].data._M_elems[0] * 0x50;
      puVar1 = (uint *)(lVar9 + 0x30 + lVar11);
      *(undefined8 *)puVar1 = local_128.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_128.data._M_elems[0xf]._1_3_,local_128.data._M_elems._56_5_);
      puVar1 = (uint *)(lVar9 + 0x20 + lVar11);
      *(undefined8 *)puVar1 = local_128.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._40_8_;
      puVar1 = (uint *)(lVar9 + 0x10 + lVar11);
      *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_128.data._M_elems._24_8_;
      *(undefined8 *)(lVar9 + lVar11) = local_128.data._M_elems._0_8_;
      *(undefined8 *)((uint *)(lVar9 + lVar11) + 2) = local_128.data._M_elems._8_8_;
      *(int *)(lVar9 + 0x40 + lVar11) = local_128.exp;
      *(bool *)(lVar9 + 0x44 + lVar11) = local_128.neg;
      *(undefined8 *)(lVar9 + 0x48 + lVar11) = local_128._72_8_;
      uVar14 = uVar14 - 1;
      lVar15 = lVar15 + -0x54;
    } while (1 < uVar14);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
LAB_003d1048:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}